

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_diff.c
# Opt level: O3

int str_diff(char *s,char *t)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  bVar1 = *s;
  bVar2 = *t;
  if (bVar1 != 0 && bVar1 == bVar2) {
    lVar3 = 4;
    while( true ) {
      bVar1 = s[lVar3 + -3];
      bVar2 = t[lVar3 + -3];
      if ((bVar1 == 0) || (bVar1 != bVar2)) break;
      bVar1 = s[lVar3 + -2];
      bVar2 = t[lVar3 + -2];
      if ((bVar1 == 0) || (bVar1 != bVar2)) break;
      bVar1 = s[lVar3 + -1];
      bVar2 = t[lVar3 + -1];
      if ((bVar1 == 0) || (bVar1 != bVar2)) break;
      bVar1 = s[lVar3];
      bVar2 = t[lVar3];
      if ((bVar1 == 0) || (lVar3 = lVar3 + 4, bVar1 != bVar2)) break;
    }
  }
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

int str_diff(register const char *s,register const char *t)
{
  register char x;

  for (;;) {
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
  }
  return ((int)(unsigned int)(unsigned char) x)
       - ((int)(unsigned int)(unsigned char) *t);
}